

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall kj::EventLoop::EventLoop(EventLoop *this)

{
  Event **ppEVar1;
  
  (this->port).ptr = (EventPort *)0x0;
  this->running = false;
  this->lastRunnableState = false;
  this->head = (Event *)0x0;
  ppEVar1 = &this->head;
  this->tail = ppEVar1;
  this->depthFirstInsertPoint = ppEVar1;
  this->breadthFirstInsertPoint = ppEVar1;
  this->wouldSleepHead = (Event *)0x0;
  this->wouldSleepTail = &this->wouldSleepHead;
  (this->executor).ptr.disposer = (Disposer *)0x0;
  (this->executor).ptr.ptr = (Executor *)0x0;
  (this->localMap).ptr.disposer = (Disposer *)0x0;
  (this->localMap).ptr.ptr = (LocalMap *)0x0;
  heap<kj::TaskSet,kj::_::LoggingErrorHandler&>
            ((kj *)&this->daemons,(LoggingErrorHandler *)&kj::_::LoggingErrorHandler::instance);
  this->currentlyFiring = (Event *)0x0;
  return;
}

Assistant:

EventLoop::EventLoop()
    : daemons(kj::heap<TaskSet>(_::LoggingErrorHandler::instance)) {}